

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O1

bool Diligent::LinuxFileSystem::DeleteDirectory(Char *strPath)

{
  int iVar1;
  string path;
  allocator local_29;
  String local_28;
  
  std::__cxx11::string::string((string *)&local_28,strPath,&local_29);
  BasicFileSystem::CorrectSlashes(&local_28,'\0');
  iVar1 = nftw(local_28._M_dataplus._M_p,DeleteDirectory::anon_class_1_0_00000001::__invoke,0x20,0xb
              );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::DeleteDirectory(const Char* strPath)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback =
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            return remove(Path);
        };

    const auto res = nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
    return res == 0;
}